

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingScanPartial<short,short,unsigned_short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint16_t *out;
  BitpackingMode BVar1;
  byte bVar2;
  short sVar3;
  data_ptr_t pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  BitpackingScanState<short,_short> *this;
  ulong uVar10;
  size_t sVar11;
  idx_t iVar12;
  long lVar13;
  idx_t iVar14;
  uint16_t *in;
  ulong size;
  uint uVar15;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar16;
  
  this = (BitpackingScanState<short,_short> *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  if (scan_count != 0) {
    iVar12 = 0;
    auVar42 = _DAT_01ddfb90;
    auVar43 = _DAT_01ddfba0;
    auVar44 = _DAT_01ddfbb0;
    auVar45 = _DAT_01ddeb40;
    auVar46 = _DAT_01ddeb50;
    do {
      if (this->current_group_offset == 0x800) {
        BitpackingScanState<short,_short>::LoadNextGroup(this);
        auVar42 = _DAT_01ddfb90;
        auVar43 = _DAT_01ddfba0;
        auVar44 = _DAT_01ddfbb0;
        auVar45 = _DAT_01ddeb40;
        auVar46 = _DAT_01ddeb50;
      }
      iVar14 = this->current_group_offset;
      BVar1 = (this->current_group).mode;
      uVar10 = scan_count - iVar12;
      if (BVar1 == CONSTANT_DELTA) {
        size = 0x800 - iVar14;
        if (uVar10 < 0x800 - iVar14) {
          size = uVar10;
        }
        if (size != 0) {
          uVar10 = 0;
          do {
            *(short *)(pdVar4 + uVar10 * 2 + iVar12 * 2 + result_offset * 2) =
                 ((short)iVar14 + (short)uVar10) * this->current_constant +
                 this->current_frame_of_reference;
            uVar10 = uVar10 + 1;
          } while (size != uVar10);
        }
LAB_0174467f:
        iVar14 = iVar14 + size;
      }
      else {
        if (BVar1 == CONSTANT) {
          size = 0x800 - iVar14;
          if (uVar10 < 0x800 - iVar14) {
            size = uVar10;
          }
          if (scan_count != iVar12) {
            sVar3 = this->current_constant;
            uVar10 = scan_count * 2 + -2 + iVar12 * -2;
            auVar21._8_4_ = (int)uVar10;
            auVar21._0_8_ = uVar10;
            auVar21._12_4_ = (int)(uVar10 >> 0x20);
            auVar17._0_8_ = uVar10 >> 1;
            auVar17._8_8_ = auVar21._8_8_ >> 1;
            lVar9 = iVar12 * 2 + 0xe + result_offset * 2;
            auVar17 = auVar17 ^ auVar46;
            lVar13 = 0;
            do {
              auVar29._8_4_ = (int)lVar13;
              auVar29._0_8_ = lVar13;
              auVar29._12_4_ = (int)((ulong)lVar13 >> 0x20);
              auVar21 = (auVar29 | auVar45) ^ auVar46;
              iVar30 = auVar17._0_4_;
              iVar36 = -(uint)(iVar30 < auVar21._0_4_);
              iVar18 = auVar17._4_4_;
              auVar22._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
              iVar35 = auVar17._8_4_;
              iVar38 = -(uint)(iVar35 < auVar21._8_4_);
              iVar19 = auVar17._12_4_;
              auVar22._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
              auVar31._4_4_ = iVar36;
              auVar31._0_4_ = iVar36;
              auVar31._8_4_ = iVar38;
              auVar31._12_4_ = iVar38;
              auVar39 = pshuflw(in_XMM5,auVar31,0xe8);
              auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
              auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
              auVar24._0_4_ = auVar24._4_4_;
              auVar24._8_4_ = auVar24._12_4_;
              auVar41 = pshuflw(in_XMM6,auVar24,0xe8);
              auVar22._0_4_ = auVar22._4_4_;
              auVar22._8_4_ = auVar22._12_4_;
              auVar21 = pshuflw(auVar39,auVar22,0xe8);
              auVar40._8_4_ = 0xffffffff;
              auVar40._0_8_ = 0xffffffffffffffff;
              auVar40._12_4_ = 0xffffffff;
              auVar40 = (auVar21 | auVar41 & auVar39) ^ auVar40;
              auVar21 = packssdw(auVar40,auVar40);
              if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -0xe) = sVar3;
              }
              auVar22 = auVar24 & auVar31 | auVar22;
              auVar21 = packssdw(auVar22,auVar22);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar5,auVar21 ^ auVar5);
              if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -0xc) = sVar3;
              }
              auVar21 = (auVar29 | auVar44) ^ auVar46;
              iVar36 = -(uint)(iVar30 < auVar21._0_4_);
              auVar37._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
              iVar38 = -(uint)(iVar35 < auVar21._8_4_);
              auVar37._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
              auVar23._4_4_ = iVar36;
              auVar23._0_4_ = iVar36;
              auVar23._8_4_ = iVar38;
              auVar23._12_4_ = iVar38;
              auVar32._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
              auVar32._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
              auVar32._0_4_ = auVar32._4_4_;
              auVar32._8_4_ = auVar32._12_4_;
              auVar37._0_4_ = auVar37._4_4_;
              auVar37._8_4_ = auVar37._12_4_;
              auVar21 = auVar32 & auVar23 | auVar37;
              auVar21 = packssdw(auVar21,auVar21);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar6,auVar21 ^ auVar6);
              if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -10) = sVar3;
              }
              auVar40 = pshufhw(auVar23,auVar23,0x84);
              auVar22 = pshufhw(auVar32,auVar32,0x84);
              auVar24 = pshufhw(auVar40,auVar37,0x84);
              auVar25._8_4_ = 0xffffffff;
              auVar25._0_8_ = 0xffffffffffffffff;
              auVar25._12_4_ = 0xffffffff;
              auVar25 = (auVar24 | auVar22 & auVar40) ^ auVar25;
              auVar40 = packssdw(auVar25,auVar25);
              if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -8) = sVar3;
              }
              auVar40 = (auVar29 | auVar43) ^ auVar46;
              iVar36 = -(uint)(iVar30 < auVar40._0_4_);
              auVar27._4_4_ = -(uint)(iVar18 < auVar40._4_4_);
              iVar38 = -(uint)(iVar35 < auVar40._8_4_);
              auVar27._12_4_ = -(uint)(iVar19 < auVar40._12_4_);
              auVar33._4_4_ = iVar36;
              auVar33._0_4_ = iVar36;
              auVar33._8_4_ = iVar38;
              auVar33._12_4_ = iVar38;
              auVar21 = pshuflw(auVar21,auVar33,0xe8);
              auVar26._4_4_ = -(uint)(auVar40._4_4_ == iVar18);
              auVar26._12_4_ = -(uint)(auVar40._12_4_ == iVar19);
              auVar26._0_4_ = auVar26._4_4_;
              auVar26._8_4_ = auVar26._12_4_;
              in_XMM6 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
              in_XMM6 = in_XMM6 & auVar21;
              auVar27._0_4_ = auVar27._4_4_;
              auVar27._8_4_ = auVar27._12_4_;
              auVar21 = pshuflw(auVar21,auVar27,0xe8);
              auVar39._8_4_ = 0xffffffff;
              auVar39._0_8_ = 0xffffffffffffffff;
              auVar39._12_4_ = 0xffffffff;
              auVar39 = (auVar21 | in_XMM6) ^ auVar39;
              in_XMM5 = packssdw(auVar39,auVar39);
              if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -6) = sVar3;
              }
              auVar27 = auVar26 & auVar33 | auVar27;
              auVar21 = packssdw(auVar27,auVar27);
              auVar41._8_4_ = 0xffffffff;
              auVar41._0_8_ = 0xffffffffffffffff;
              auVar41._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
              if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -4) = sVar3;
              }
              auVar21 = (auVar29 | auVar42) ^ auVar46;
              iVar30 = -(uint)(iVar30 < auVar21._0_4_);
              auVar34._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
              iVar35 = -(uint)(iVar35 < auVar21._8_4_);
              auVar34._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
              auVar28._4_4_ = iVar30;
              auVar28._0_4_ = iVar30;
              auVar28._8_4_ = iVar35;
              auVar28._12_4_ = iVar35;
              auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
              auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
              auVar20._0_4_ = auVar20._4_4_;
              auVar20._8_4_ = auVar20._12_4_;
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              auVar21 = auVar20 & auVar28 | auVar34;
              auVar21 = packssdw(auVar21,auVar21);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 ^ auVar7,auVar21 ^ auVar7);
              if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9 + -2) = sVar3;
              }
              auVar40 = pshufhw(auVar28,auVar28,0x84);
              auVar21 = pshufhw(auVar20,auVar20,0x84);
              auVar29 = pshufhw(auVar40,auVar34,0x84);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar21 = packssdw(auVar21 & auVar40,(auVar29 | auVar21 & auVar40) ^ auVar8);
              if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(short *)(pdVar4 + lVar13 * 2 + lVar9) = sVar3;
              }
              lVar13 = lVar13 + 8;
            } while ((uVar10 >> 4) * 8 + 8 != lVar13);
          }
          goto LAB_0174467f;
        }
        uVar15 = (uint)iVar14 & 0x1f;
        uVar16 = (ulong)uVar15;
        size = 0x20 - uVar16;
        if (uVar10 < 0x20 - uVar16) {
          size = uVar10;
        }
        bVar2 = this->current_width;
        in = (uint16_t *)
             (this->current_group_ptr + ((iVar14 * bVar2 >> 3) - (ulong)(uVar15 * bVar2 >> 3)));
        out = (uint16_t *)(pdVar4 + iVar12 * 2 + result_offset * 2);
        uVar15 = (uint)bVar2;
        if ((size == 0x20) && (uVar16 == 0)) {
          duckdb_fastpforlib::internal::fastunpack_half(in,out,(uint)bVar2);
          duckdb_fastpforlib::internal::fastunpack_half(in + bVar2,out + 0x10,uVar15);
        }
        else {
          duckdb_fastpforlib::internal::fastunpack_half
                    (in,(uint16_t *)this->decompression_buffer,uVar15);
          duckdb_fastpforlib::internal::fastunpack_half
                    (in + bVar2,(uint16_t *)(this->decompression_buffer + 0x10),uVar15);
          switchD_012e1ce8::default(out,this->decompression_buffer + uVar16,size * 2);
        }
        auVar44 = _DAT_01ddfbb0;
        auVar43 = _DAT_01ddfba0;
        auVar42 = _DAT_01ddfb90;
        if ((this->current_group).mode == DELTA_FOR) {
          sVar3 = this->current_frame_of_reference;
          if (sVar3 != 0 && scan_count != iVar12) {
            sVar11 = 0;
            do {
              out[sVar11] = out[sVar11] + sVar3;
              sVar11 = sVar11 + 1;
            } while (size != sVar11);
          }
          DeltaDecode<short>((short *)out,this->current_delta_offset,size);
          this->current_delta_offset = out[size - 1];
          auVar42 = _DAT_01ddfb90;
          auVar43 = _DAT_01ddfba0;
          auVar44 = _DAT_01ddfbb0;
        }
        else {
          sVar3 = this->current_frame_of_reference;
          if (sVar3 != 0 && scan_count != iVar12) {
            sVar11 = 0;
            do {
              out[sVar11] = out[sVar11] + sVar3;
              sVar11 = sVar11 + 1;
            } while (size != sVar11);
          }
        }
        iVar14 = this->current_group_offset + size;
        auVar45 = _DAT_01ddeb40;
        auVar46 = _DAT_01ddeb50;
      }
      this->current_group_offset = iVar14;
      iVar12 = iVar12 + size;
    } while (iVar12 < scan_count);
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}